

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonevector.h
# Opt level: O0

Error __thiscall
asmjit::v1_14::ZoneVector<asmjit::v1_14::Pass_*>::append
          (ZoneVector<asmjit::v1_14::Pass_*> *this,ZoneAllocator *allocator,Pass **item)

{
  undefined8 *in_RDX;
  ZoneVector<asmjit::v1_14::Pass_*> *in_RDI;
  Error _err;
  ZoneAllocator *in_stack_ffffffffffffffc8;
  Error local_4;
  
  if ((*(int *)(in_RDI + 8) != *(int *)(in_RDI + 0xc)) ||
     (local_4 = grow(in_RDI,in_stack_ffffffffffffffc8,0), local_4 == 0)) {
    *(undefined8 *)(*(long *)in_RDI + (ulong)*(uint *)(in_RDI + 8) * 8) = *in_RDX;
    *(int *)(in_RDI + 8) = *(int *)(in_RDI + 8) + 1;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

ASMJIT_FORCE_INLINE Error append(ZoneAllocator* allocator, const T& item) noexcept {
    if (ASMJIT_UNLIKELY(_size == _capacity))
      ASMJIT_PROPAGATE(grow(allocator, 1));

    memcpy(static_cast<void*>(static_cast<T*>(_data) + _size),
           static_cast<const void*>(&item),
           sizeof(T));

    _size++;
    return kErrorOk;
  }